

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_mul_shortcuts
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              mbedtls_ecp_restart_ctx *rs_ctx)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi *X;
  mbedtls_mpi_uint *in_stack_ffffffffffffffc8;
  mbedtls_mpi tmp;
  
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffc8);
  iVar1 = mbedtls_mpi_cmp_int(m,0);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_check_pubkey(grp,P);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_set_zero(R);
    }
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(m,1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_check_pubkey(grp,P);
      if (iVar1 == 0) {
        iVar1 = mbedtls_ecp_copy(R,P);
      }
    }
    else {
      iVar1 = mbedtls_mpi_cmp_int(m,-1);
      if (iVar1 == 0) {
        iVar1 = mbedtls_ecp_check_pubkey(grp,P);
        if (iVar1 == 0) {
          iVar1 = mbedtls_ecp_copy(R,P);
          if (iVar1 == 0) {
            X = &R->Y;
            iVar2 = mbedtls_mpi_cmp_int(X,0);
            iVar1 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&stack0xffffffffffffffc8,&grp->P,X);
            if (iVar1 == 0) {
              iVar1 = mbedtls_mpi_safe_cond_assign
                                (X,(mbedtls_mpi *)&stack0xffffffffffffffc8,iVar2 != 0);
            }
          }
        }
      }
      else {
        iVar1 = ecp_mul_restartable_internal
                          (grp,R,m,P,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,
                           in_stack_ffffffffffffffc8);
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&stack0xffffffffffffffc8);
  return iVar1;
}

Assistant:

static int mbedtls_ecp_mul_shortcuts(mbedtls_ecp_group *grp,
                                     mbedtls_ecp_point *R,
                                     const mbedtls_mpi *m,
                                     const mbedtls_ecp_point *P,
                                     mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi tmp;
    mbedtls_mpi_init(&tmp);

    if (mbedtls_mpi_cmp_int(m, 0) == 0) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
        MBEDTLS_MPI_CHK(mbedtls_ecp_set_zero(R));
    } else if (mbedtls_mpi_cmp_int(m, 1) == 0) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
        MBEDTLS_MPI_CHK(mbedtls_ecp_copy(R, P));
    } else if (mbedtls_mpi_cmp_int(m, -1) == 0) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
        MBEDTLS_MPI_CHK(mbedtls_ecp_copy(R, P));
        MPI_ECP_NEG(&R->Y);
    } else {
        MBEDTLS_MPI_CHK(ecp_mul_restartable_internal(grp, R, m, P,
                                                     NULL, NULL, rs_ctx));
    }

cleanup:
    mbedtls_mpi_free(&tmp);

    return ret;
}